

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_panel.cpp
# Opt level: O0

int max_item_height_proc(Am_Object *self)

{
  int iVar1;
  bool bVar2;
  Am_Value_Type AVar3;
  Am_Value *pAVar4;
  int local_3c;
  int item_height;
  Am_Object item;
  int height;
  undefined1 local_20 [8];
  Am_Value_List components;
  Am_Object *self_local;
  
  components.item = (Am_List_Item *)self;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20);
  pAVar4 = Am_Object::Get((Am_Object *)components.item,0x82,0);
  Am_Value_List::operator=((Am_Value_List *)local_20,pAVar4);
  item.data._0_4_ = 0;
  Am_Value_List::Start((Am_Value_List *)local_20);
  while (bVar2 = Am_Value_List::Last((Am_Value_List *)local_20), iVar1 = (int)item.data,
        ((bVar2 ^ 0xffU) & 1) != 0) {
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffc8);
    pAVar4 = Am_Value_List::Get((Am_Value_List *)local_20);
    Am_Object::operator=((Am_Object *)&stack0xffffffffffffffc8,pAVar4);
    pAVar4 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc8,0x69,0);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
    if (bVar2) {
      AVar3 = Am_Object::Get_Slot_Type((Am_Object *)&stack0xffffffffffffffc8,0x1d1,0);
      if (AVar3 == 2) {
        pAVar4 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc8,0x1d1,0);
        local_3c = Am_Value::operator_cast_to_int(pAVar4);
      }
      else {
        pAVar4 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffc8,0x67,0);
        local_3c = Am_Value::operator_cast_to_int(pAVar4);
      }
      if ((int)item.data < local_3c) {
        item.data._0_4_ = local_3c;
      }
    }
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffc8);
    Am_Value_List::Next((Am_Value_List *)local_20);
  }
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
  return iVar1;
}

Assistant:

Am_Define_Formula(int, max_item_height)
{
  // based on Am_map_width in opal.cc
  // finds width of widest visible item

  Am_Value_List components;
  components = self.Get(Am_GRAPHICAL_PARTS);
  int height = 0;
  for (components.Start(); !components.Last(); components.Next()) {
    Am_Object item;
    item = components.Get();
    if ((bool)item.Get(Am_VISIBLE)) {
      int item_height;
      if (item.Get_Slot_Type(Am_REAL_HEIGHT) == Am_INT)
        item_height = item.Get(Am_REAL_HEIGHT);
      else
        item_height = item.Get(Am_HEIGHT);
      if (item_height > height)
        height = item_height;
    }
  }
  return height;
}